

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O2

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::~help
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  ~help(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

~help () override = default;